

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vlvg(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar1;
  MemOp_conflict MVar2;
  int iVar3;
  int reg;
  TCGv_ptr ptr;
  MemOp_conflict memop;
  DisasJumpType DVar4;
  
  tcg_ctx = s->uc->tcg_ctx;
  MVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  memop = MVar2 & 0xff;
  if (memop < MO_ASHIFT) {
    iVar3 = get_field1(s,FLD_O_b2,FLD_C_b2);
    if (iVar3 == 0) {
      iVar3 = get_field1(s,FLD_O_d2,FLD_C_d2);
      pTVar1 = o->in2;
      DVar4 = DISAS_NEXT;
      reg = get_field1(s,FLD_O_v1,FLD_C_b1);
      write_vec_element_i64
                (tcg_ctx,pTVar1,reg,(char)(0x10 >> ((byte)MVar2 & 0x1f)) - 1U & (byte)iVar3,memop);
    }
    else {
      ptr = tcg_temp_new_ptr(tcg_ctx);
      iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
      get_vec_element_ptr_i64(tcg_ctx,ptr,(uint8_t)iVar3,o->addr1,(byte)MVar2);
      pTVar1 = o->in2;
      switch(memop) {
      case MO_8:
        tcg_gen_st8_i64(tcg_ctx,pTVar1,ptr,0);
        break;
      case MO_16:
        tcg_gen_st16_i64(tcg_ctx,pTVar1,ptr,0);
        break;
      case MO_32:
        tcg_gen_st32_i64(tcg_ctx,pTVar1,ptr,0);
        break;
      case MO_64:
        tcg_gen_st_i64_s390x(tcg_ctx,pTVar1,ptr,0);
      }
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
      DVar4 = DISAS_NEXT;
    }
  }
  else {
    gen_program_exception(s,6);
    DVar4 = DISAS_NORETURN;
  }
  return DVar4;
}

Assistant:

static DisasJumpType op_vlvg(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);
    TCGv_ptr ptr;

    if (es > ES_64) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* fast path if we don't need the register content */
    if (!get_field(s, b2)) {
        uint8_t enr = get_field(s, d2) & (NUM_VEC_ELEMENTS(es) - 1);

        write_vec_element_i64(tcg_ctx, o->in2, get_field(s, v1), enr, es);
        return DISAS_NEXT;
    }

    ptr = tcg_temp_new_ptr(tcg_ctx);
    get_vec_element_ptr_i64(tcg_ctx, ptr, get_field(s, v1), o->addr1, es);
    switch (es) {
    case ES_8:
        tcg_gen_st8_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_16:
        tcg_gen_st16_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_32:
        tcg_gen_st32_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_64:
        tcg_gen_st_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    default:
        // g_assert_not_reached();
        break;
    }
    tcg_temp_free_ptr(tcg_ctx, ptr);

    return DISAS_NEXT;
}